

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_error_strerror.c
# Opt level: O3

char * zip_error_strerror(zip_error_t *err)

{
  bool bVar1;
  char *__s;
  char *__s_00;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  long lVar5;
  char *__s_01;
  char buf [128];
  char acStack_a8 [128];
  
  __s = acStack_a8;
  zip_error_fini(err);
  lVar5 = (long)err->zip_err;
  if ((lVar5 < 0) || (0x20 < err->zip_err)) {
    sprintf(acStack_a8,"Unknown error %d");
    sVar2 = strlen(acStack_a8);
  }
  else {
    __s_01 = _zip_err_str[lVar5];
    if (_zip_err_type[lVar5] == 2) {
      __s = (char *)zError(err->sys_err);
    }
    else {
      if (_zip_err_type[lVar5] != 1) {
        return __s_01;
      }
      __s = strerror(err->sys_err);
    }
    if (__s == (char *)0x0) {
      return __s_01;
    }
    sVar2 = strlen(__s);
    if (__s_01 != (char *)0x0) {
      sVar3 = strlen(__s_01);
      lVar5 = sVar3 + 2;
      bVar1 = false;
      goto LAB_00107ca5;
    }
  }
  __s_01 = (char *)0x0;
  bVar1 = true;
  lVar5 = 0;
LAB_00107ca5:
  __s_00 = (char *)malloc(sVar2 + lVar5 + 1);
  if (__s_00 == (char *)0x0) {
    __s_00 = "Malloc failure";
  }
  else {
    if (bVar1) {
      __s_01 = "";
    }
    pcVar4 = ": ";
    if (bVar1) {
      pcVar4 = "";
    }
    sprintf(__s_00,"%s%s%s",__s_01,pcVar4,__s);
    err->str = __s_00;
  }
  return __s_00;
}

Assistant:

ZIP_EXTERN const char *
zip_error_strerror(zip_error_t *err) {
    const char *zs, *ss;
    char buf[128], *s;

    zip_error_fini(err);

    if (err->zip_err < 0 || err->zip_err >= _zip_nerr_str) {
	sprintf(buf, "Unknown error %d", err->zip_err);
	zs = NULL;
	ss = buf;
    }
    else {
	zs = _zip_err_str[err->zip_err];

	switch (_zip_err_type[err->zip_err]) {
	case ZIP_ET_SYS:
	    ss = strerror(err->sys_err);
	    break;

	case ZIP_ET_ZLIB:
	    ss = zError(err->sys_err);
	    break;

	default:
	    ss = NULL;
	}
    }

    if (ss == NULL)
	return zs;
    else {
	if ((s = (char *)malloc(strlen(ss) + (zs ? strlen(zs) + 2 : 0) + 1)) == NULL)
	    return _zip_err_str[ZIP_ER_MEMORY];

	sprintf(s, "%s%s%s", (zs ? zs : ""), (zs ? ": " : ""), ss);
	err->str = s;

	return s;
    }
}